

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::HeapBucketGroup<MediumAllocationBlockAttributes>::PrepareSweep
          (HeapBucketGroup<MediumAllocationBlockAttributes> *this)

{
  HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::ClearAllocators
            ((HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *)this);
  HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::ClearAllocators
            (&(this->leafHeapBucket).
              super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  ClearAllocators((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                   *)&this->smallNormalWithBarrierHeapBucket);
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  ClearAllocators((HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                   *)&this->smallFinalizableWithBarrierHeapBucket);
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::ClearAllocators
            ((HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *)
             &this->finalizableHeapBucket);
  return;
}

Assistant:

void
HeapBucketGroup<TBlockAttributes>::PrepareSweep()
{
    heapBucket.PrepareSweep();
    leafHeapBucket.PrepareSweep();
#ifdef RECYCLER_WRITE_BARRIER
    smallNormalWithBarrierHeapBucket.PrepareSweep();
    smallFinalizableWithBarrierHeapBucket.PrepareSweep();
#endif
    finalizableHeapBucket.PrepareSweep();
#ifdef RECYCLER_VISITED_HOST
    recyclerVisitedHostHeapBucket.PrepareSweep();
#endif
}